

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::Arguments(Arguments *this)

{
  value_type local_18;
  Arguments *local_10;
  Arguments *this_local;
  
  local_10 = this;
  std::vector<char_*,_std::allocator<char_*>_>::vector(&this->args_);
  local_18 = (value_type)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->args_,&local_18);
  return;
}

Assistant:

Arguments() {
    args_.push_back(NULL);
  }